

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int chol(double *A,int N)

{
  undefined4 local_18;
  int sc;
  int N_local;
  double *A_local;
  
  if (N < 0x41) {
    local_18 = cholu(A,N);
  }
  else {
    local_18 = bcholu(A,N);
  }
  return local_18;
}

Assistant:

int chol(double *A, int N) {
	int sc;
	if ( N <= (int) BLOCKSIZE) {
		sc = cholu(A,N);
	} else {
		sc = bcholu(A,N);
	}
	return sc;
}